

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_swift_generator.cc
# Opt level: O1

string * __thiscall
t_swift_generator::async_function_signature_abi_cxx11_
          (string *__return_storage_ptr__,t_swift_generator *this,t_function *tfunction)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  t_type *ttype;
  pointer pcVar3;
  t_struct *ptVar4;
  int iVar5;
  long *plVar6;
  undefined8 *puVar7;
  size_type *psVar8;
  long *plVar9;
  string *psVar10;
  string response_param;
  string local_178;
  string local_158;
  string *local_138;
  string local_130;
  long *local_110;
  long local_108;
  long local_100;
  long lStack_f8;
  long *local_f0;
  long local_e8;
  long local_e0;
  long lStack_d8;
  long *local_d0;
  long local_c8;
  long local_c0;
  long lStack_b8;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  ttype = tfunction->returntype_;
  if (this->gen_cocoa_ == true) {
    function_name_abi_cxx11_(&local_158,this,tfunction);
  }
  else {
    local_158._M_dataplus._M_p = (pointer)&local_158.field_2;
    pcVar3 = (tfunction->name_)._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_158,pcVar3,pcVar3 + (tfunction->name_)._M_string_length);
  }
  std::operator+(__return_storage_ptr__,"func ",&local_158);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_158._M_dataplus._M_p != &local_158.field_2) {
    operator_delete(local_158._M_dataplus._M_p);
  }
  local_138 = __return_storage_ptr__;
  if (this->gen_cocoa_ == false) {
    local_158._M_dataplus._M_p = (pointer)&local_158.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_158,"(Result<","");
    iVar5 = (*(ttype->super_t_doc)._vptr_t_doc[4])(ttype);
    if ((char)iVar5 == '\0') {
      type_name_abi_cxx11_(&local_178,this,ttype,false,false);
    }
    else {
      local_178._M_dataplus._M_p = (pointer)&local_178.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_178,"Void","");
    }
    std::__cxx11::string::_M_append((char *)&local_158,(ulong)local_178._M_dataplus._M_p);
    paVar1 = &local_178.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_178._M_dataplus._M_p != paVar1) {
      operator_delete(local_178._M_dataplus._M_p);
    }
    std::__cxx11::string::append((char *)&local_158);
    ptVar4 = tfunction->arglist_;
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"","");
    argument_list(&local_b0,this,ptVar4,&local_70,false);
    plVar6 = (long *)std::__cxx11::string::replace((ulong)&local_b0,0,(char *)0x0,0x3a1f75);
    plVar9 = plVar6 + 2;
    if ((long *)*plVar6 == plVar9) {
      local_100 = *plVar9;
      lStack_f8 = plVar6[3];
      local_110 = &local_100;
    }
    else {
      local_100 = *plVar9;
      local_110 = (long *)*plVar6;
    }
    local_108 = plVar6[1];
    *plVar6 = (long)plVar9;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    plVar6 = (long *)std::__cxx11::string::append((char *)&local_110);
    plVar9 = plVar6 + 2;
    if ((long *)*plVar6 == plVar9) {
      local_e0 = *plVar9;
      lStack_d8 = plVar6[3];
      local_f0 = &local_e0;
    }
    else {
      local_e0 = *plVar9;
      local_f0 = (long *)*plVar6;
    }
    local_e8 = plVar6[1];
    *plVar6 = (long)plVar9;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    plVar6 = (long *)std::__cxx11::string::append((char *)&local_f0);
    plVar9 = plVar6 + 2;
    if ((long *)*plVar6 == plVar9) {
      local_c0 = *plVar9;
      lStack_b8 = plVar6[3];
      local_d0 = &local_c0;
    }
    else {
      local_c0 = *plVar9;
      local_d0 = (long *)*plVar6;
    }
    local_c8 = plVar6[1];
    *plVar6 = (long)plVar9;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    plVar6 = (long *)std::__cxx11::string::_M_append
                               ((char *)&local_d0,(ulong)local_158._M_dataplus._M_p);
    psVar8 = (size_type *)(plVar6 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar6 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar8) {
      local_130.field_2._M_allocated_capacity = *psVar8;
      local_130.field_2._8_8_ = plVar6[3];
      local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
    }
    else {
      local_130.field_2._M_allocated_capacity = *psVar8;
      local_130._M_dataplus._M_p = (pointer)*plVar6;
    }
    local_130._M_string_length = plVar6[1];
    *plVar6 = (long)psVar8;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    plVar6 = (long *)std::__cxx11::string::append((char *)&local_130);
    psVar8 = (size_type *)(plVar6 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar6 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar8) {
      local_178.field_2._M_allocated_capacity = *psVar8;
      local_178.field_2._8_8_ = plVar6[3];
      local_178._M_dataplus._M_p = (pointer)paVar1;
    }
    else {
      local_178.field_2._M_allocated_capacity = *psVar8;
      local_178._M_dataplus._M_p = (pointer)*plVar6;
    }
    local_178._M_string_length = plVar6[1];
    *plVar6 = (long)psVar8;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    std::__cxx11::string::_M_append((char *)local_138,(ulong)local_178._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_178._M_dataplus._M_p != paVar1) {
      operator_delete(local_178._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_130._M_dataplus._M_p != &local_130.field_2) {
      operator_delete(local_130._M_dataplus._M_p);
    }
    if (local_d0 != &local_c0) {
      operator_delete(local_d0);
    }
    if (local_f0 != &local_e0) {
      operator_delete(local_f0);
    }
    if (local_110 != &local_100) {
      operator_delete(local_110);
    }
    psVar10 = local_138;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
      operator_delete(local_b0._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_158._M_dataplus._M_p == &local_158.field_2) {
      return psVar10;
    }
  }
  else {
    iVar5 = (*(ttype->super_t_doc)._vptr_t_doc[4])(ttype);
    if ((char)iVar5 == '\0') {
      type_name_abi_cxx11_(&local_130,this,ttype,false,false);
    }
    else {
      local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_130);
    }
    plVar6 = (long *)std::__cxx11::string::replace((ulong)&local_130,0,(char *)0x0,0x3a1f75);
    paVar1 = &local_178.field_2;
    psVar8 = (size_type *)(plVar6 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar6 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar8) {
      local_178.field_2._M_allocated_capacity = *psVar8;
      local_178.field_2._8_8_ = plVar6[3];
      local_178._M_dataplus._M_p = (pointer)paVar1;
    }
    else {
      local_178.field_2._M_allocated_capacity = *psVar8;
      local_178._M_dataplus._M_p = (pointer)*plVar6;
    }
    local_178._M_string_length = plVar6[1];
    *plVar6 = (long)psVar8;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    plVar6 = (long *)std::__cxx11::string::append((char *)&local_178);
    local_158._M_dataplus._M_p = (pointer)&local_158.field_2;
    psVar8 = (size_type *)(plVar6 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar6 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar8) {
      local_158.field_2._M_allocated_capacity = *psVar8;
      local_158.field_2._8_8_ = plVar6[3];
    }
    else {
      local_158.field_2._M_allocated_capacity = *psVar8;
      local_158._M_dataplus._M_p = (pointer)*plVar6;
    }
    local_158._M_string_length = plVar6[1];
    *plVar6 = (long)psVar8;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_178._M_dataplus._M_p != paVar1) {
      operator_delete(local_178._M_dataplus._M_p);
    }
    paVar2 = &local_130.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_130._M_dataplus._M_p != paVar2) {
      operator_delete(local_130._M_dataplus._M_p);
    }
    ptVar4 = tfunction->arglist_;
    local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"","");
    argument_list(&local_50,this,ptVar4,&local_90,false);
    plVar6 = (long *)std::__cxx11::string::replace((ulong)&local_50,0,(char *)0x0,0x3a1f75);
    psVar8 = (size_type *)(plVar6 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar6 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar8) {
      local_b0.field_2._M_allocated_capacity = *psVar8;
      local_b0.field_2._8_8_ = plVar6[3];
      local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
    }
    else {
      local_b0.field_2._M_allocated_capacity = *psVar8;
      local_b0._M_dataplus._M_p = (pointer)*plVar6;
    }
    local_b0._M_string_length = plVar6[1];
    *plVar6 = (long)psVar8;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    puVar7 = (undefined8 *)std::__cxx11::string::append((char *)&local_b0);
    plVar6 = puVar7 + 2;
    if ((long *)*puVar7 == plVar6) {
      local_100 = *plVar6;
      lStack_f8 = puVar7[3];
      local_110 = &local_100;
    }
    else {
      local_100 = *plVar6;
      local_110 = (long *)*puVar7;
    }
    local_108 = puVar7[1];
    *puVar7 = plVar6;
    puVar7[1] = 0;
    *(undefined1 *)(puVar7 + 2) = 0;
    puVar7 = (undefined8 *)std::__cxx11::string::append((char *)&local_110);
    plVar6 = puVar7 + 2;
    if ((long *)*puVar7 == plVar6) {
      local_e0 = *plVar6;
      lStack_d8 = puVar7[3];
      local_f0 = &local_e0;
    }
    else {
      local_e0 = *plVar6;
      local_f0 = (long *)*puVar7;
    }
    local_e8 = puVar7[1];
    *puVar7 = plVar6;
    puVar7[1] = 0;
    *(undefined1 *)(puVar7 + 2) = 0;
    puVar7 = (undefined8 *)
             std::__cxx11::string::_M_append((char *)&local_f0,(ulong)local_158._M_dataplus._M_p);
    plVar6 = puVar7 + 2;
    if ((long *)*puVar7 == plVar6) {
      local_c0 = *plVar6;
      lStack_b8 = puVar7[3];
      local_d0 = &local_c0;
    }
    else {
      local_c0 = *plVar6;
      local_d0 = (long *)*puVar7;
    }
    local_c8 = puVar7[1];
    *puVar7 = plVar6;
    puVar7[1] = 0;
    *(undefined1 *)(puVar7 + 2) = 0;
    puVar7 = (undefined8 *)std::__cxx11::string::append((char *)&local_d0);
    psVar8 = puVar7 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar7 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar8) {
      local_130.field_2._M_allocated_capacity = *psVar8;
      local_130.field_2._8_8_ = puVar7[3];
      local_130._M_dataplus._M_p = (pointer)paVar2;
    }
    else {
      local_130.field_2._M_allocated_capacity = *psVar8;
      local_130._M_dataplus._M_p = (pointer)*puVar7;
    }
    local_130._M_string_length = puVar7[1];
    *puVar7 = psVar8;
    puVar7[1] = 0;
    *(undefined1 *)(puVar7 + 2) = 0;
    puVar7 = (undefined8 *)std::__cxx11::string::append((char *)&local_130);
    psVar8 = puVar7 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar7 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar8) {
      local_178.field_2._M_allocated_capacity = *psVar8;
      local_178.field_2._8_8_ = puVar7[3];
      local_178._M_dataplus._M_p = (pointer)paVar1;
    }
    else {
      local_178.field_2._M_allocated_capacity = *psVar8;
      local_178._M_dataplus._M_p = (pointer)*puVar7;
    }
    local_178._M_string_length = puVar7[1];
    *puVar7 = psVar8;
    puVar7[1] = 0;
    *(undefined1 *)(puVar7 + 2) = 0;
    std::__cxx11::string::_M_append((char *)local_138,(ulong)local_178._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_178._M_dataplus._M_p != paVar1) {
      operator_delete(local_178._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_130._M_dataplus._M_p != paVar2) {
      operator_delete(local_130._M_dataplus._M_p);
    }
    psVar10 = local_138;
    if (local_d0 != &local_c0) {
      operator_delete(local_d0);
    }
    if (local_f0 != &local_e0) {
      operator_delete(local_f0);
    }
    if (local_110 != &local_100) {
      operator_delete(local_110);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
      operator_delete(local_b0._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) {
      operator_delete(local_90._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_158._M_dataplus._M_p == &local_158.field_2) {
      return psVar10;
    }
  }
  operator_delete(local_158._M_dataplus._M_p);
  return psVar10;
}

Assistant:

string t_swift_generator::async_function_signature(t_function* tfunction) {
  t_type* ttype = tfunction->get_returntype();
  t_struct* targlist = tfunction->get_arglist();
  string result = "func " + (gen_cocoa_ ? function_name(tfunction) : tfunction->get_name());

  if (!gen_cocoa_) {
    string response_string = "(Result<";
    response_string += (ttype->is_void()) ? "Void" : type_name(ttype);
    response_string += ", Error>) -> Void";
    result += "(" + argument_list(tfunction->get_arglist(), "", false)
            + (targlist->get_members().size() ? ", " : "")
            + "completion: @escaping " + response_string + ")";
  } else {
    string response_param = "(" + ((ttype->is_void()) ? "" : type_name(ttype)) + ") -> Void";
    result += "(" + argument_list(tfunction->get_arglist(), "", false)
            + (targlist->get_members().size() ? ", " : "")
            + "success: " + response_param + ", "
            + "failure: (NSError) -> Void) throws";
  }
  return result;
}